

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

UBool __thiscall icu_63::OrConstraint::isFulfilled(OrConstraint *this,IFixedDecimal *number)

{
  AndConstraint *this_00;
  char cVar1;
  AndConstraint **ppAVar2;
  
  cVar1 = '\0';
  while ((this != (OrConstraint *)0x0 && (cVar1 == '\0'))) {
    cVar1 = '\x01';
    ppAVar2 = &this->childNode;
    while ((cVar1 != '\0' && (this_00 = *ppAVar2, this_00 != (AndConstraint *)0x0))) {
      cVar1 = AndConstraint::isFulfilled(this_00,number);
      ppAVar2 = &this_00->next;
    }
    this = this->next;
  }
  return cVar1;
}

Assistant:

UBool
OrConstraint::isFulfilled(const IFixedDecimal &number) {
    OrConstraint* orRule=this;
    UBool result=FALSE;

    while (orRule!=nullptr && !result) {
        result=TRUE;
        AndConstraint* andRule = orRule->childNode;
        while (andRule!=nullptr && result) {
            result = andRule->isFulfilled(number);
            andRule=andRule->next;
        }
        orRule = orRule->next;
    }

    return result;
}